

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simMan.c
# Opt level: O1

Sim_Man_t * Sim_ManStart(Abc_Ntk_t *pNtk,int fLightweight)

{
  uint uVar1;
  Sim_Man_t *__s;
  Vec_Ptr_t *pVVar2;
  Extra_MmFixed_t *pEVar3;
  void **ppvVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Vec_t *pVVar7;
  void **ppvVar8;
  undefined8 *puVar9;
  uint uVar10;
  int nWords;
  ulong uVar11;
  
  __s = (Sim_Man_t *)malloc(0xa8);
  memset(__s,0,0xa8);
  __s->pNtk = pNtk;
  uVar1 = pNtk->vCis->nSize;
  __s->nInputs = uVar1;
  __s->nOutputs = pNtk->vCos->nSize;
  __s->nSimBits = 0x800;
  __s->nSimWords = 0x40;
  pVVar2 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,0x40,0);
  __s->vSim0 = pVVar2;
  __s->fLightweight = fLightweight;
  if (fLightweight == 0) {
    ppvVar8 = (void **)0x0;
    pVVar2 = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,0x40,0);
    __s->vSim1 = pVVar2;
    uVar10 = pNtk->vCis->nSize;
    __s->nSuppBits = uVar10;
    nWords = (((int)uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
    __s->nSuppWords = nWords;
    pVVar2 = Sim_ComputeStrSupp(pNtk);
    __s->vSuppStr = pVVar2;
    pVVar2 = Sim_UtilInfoAlloc(pNtk->vCos->nSize,nWords,1);
    __s->vSuppFun = pVVar2;
    pEVar3 = Extra_MmFixedStart(nWords * 4 + 0x10);
    __s->pMmPat = pEVar3;
    pVVar2 = (Vec_Ptr_t *)malloc(0x10);
    pVVar2->nCap = 100;
    pVVar2->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    pVVar2->pArray = ppvVar4;
    __s->vFifo = pVVar2;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(400);
    pVVar5->pArray = piVar6;
    __s->vDiffs = pVVar5;
    pVVar7 = (Vec_Vec_t *)malloc(0x10);
    uVar10 = 8;
    if (6 < uVar1 - 1) {
      uVar10 = uVar1;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = uVar10;
    if (uVar10 != 0) {
      ppvVar8 = (void **)malloc((long)(int)uVar10 << 3);
    }
    pVVar7->pArray = ppvVar8;
    if (0 < (int)uVar1) {
      uVar11 = 0;
      do {
        puVar9 = (undefined8 *)malloc(0x10);
        *puVar9 = 0;
        puVar9[1] = 0;
        ppvVar8[uVar11] = puVar9;
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    pVVar7->nSize = uVar1;
    __s->vSuppTargs = pVVar7;
  }
  return __s;
}

Assistant:

Sim_Man_t * Sim_ManStart( Abc_Ntk_t * pNtk, int fLightweight )
{
    Sim_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Sim_Man_t, 1 );
    memset( p, 0, sizeof(Sim_Man_t) );
    p->pNtk = pNtk;
    p->nInputs    = Abc_NtkCiNum(p->pNtk);
    p->nOutputs   = Abc_NtkCoNum(p->pNtk);
    // internal simulation information
    p->nSimBits   = 2048;
    p->nSimWords  = SIM_NUM_WORDS(p->nSimBits);
    p->vSim0      = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
    p->fLightweight = fLightweight;
    if (!p->fLightweight) {
        p->vSim1      = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), p->nSimWords, 0 );
        // support information
        p->nSuppBits  = Abc_NtkCiNum(pNtk);
        p->nSuppWords = SIM_NUM_WORDS(p->nSuppBits);
        p->vSuppStr   = Sim_ComputeStrSupp( pNtk );
        p->vSuppFun   = Sim_UtilInfoAlloc( Abc_NtkCoNum(p->pNtk),  p->nSuppWords, 1 );
        // other data
        p->pMmPat     = Extra_MmFixedStart( sizeof(Sim_Pat_t) + p->nSuppWords * sizeof(unsigned) ); 
        p->vFifo      = Vec_PtrAlloc( 100 );
        p->vDiffs     = Vec_IntAlloc( 100 );
        // allocate support targets (array of unresolved outputs for each input)
        p->vSuppTargs = Vec_VecStart( p->nInputs );
    }
    return p;
}